

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavaOPL3.hpp
# Opt level: O2

void __thiscall ADL_JavaOPL3::OPL3::updateChannelPans(OPL3 *this)

{
  int i;
  long lVar1;
  Channel *(*papCVar2) [9];
  int array;
  long lVar3;
  
  papCVar2 = this->channels;
  for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
    for (lVar1 = 0; lVar1 != 9; lVar1 = lVar1 + 1) {
      this->registers[(long)(*papCVar2)[lVar1]->channelBaseAddress + 0xc0] =
           this->registers[(long)(*papCVar2)[lVar1]->channelBaseAddress + 0xc0] | 0xf0;
      Channel::updatePan((*papCVar2)[lVar1],this);
    }
    papCVar2 = papCVar2 + 1;
  }
  return;
}

Assistant:

void OPL3::updateChannelPans() {
    for(int array=0; array<2; array++)
        for(int i=0; i<9; i++) {
            int baseAddress = channels[array][i]->channelBaseAddress;
			registers[baseAddress+ChannelData::CHD1_CHC1_CHB1_CHA1_FB3_CNT1_Offset] |= 0xF0;
            channels[array][i]->updatePan(this);
        }

}